

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestImplicitOutputOnlyParse::Run(GraphTestImplicitOutputOnlyParse *this)

{
  Test *pTVar1;
  int iVar2;
  bool condition;
  int iVar3;
  Node *pNVar4;
  Edge *pEVar5;
  size_type sVar6;
  reference ppNVar7;
  string *__rhs;
  Edge *pEVar8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  Edge *local_28;
  Edge *edge;
  int local_14;
  GraphTestImplicitOutputOnlyParse *pGStack_10;
  int fail_count;
  GraphTestImplicitOutputOnlyParse *this_local;
  
  pGStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&edge + 4));
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build | out.imp: cat in\n",stack0xffffffffffffffe4);
  iVar2 = local_14;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"out.imp",&local_49);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_48);
    pEVar5 = Node::in_edge(pNVar4);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    pTVar1 = g_current_test;
    local_28 = pEVar5;
    sVar6 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&pEVar5->outputs_);
    testing::Test::Check
              (pTVar1,sVar6 == 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x99,"1 == edge->outputs_.size()");
    pTVar1 = g_current_test;
    ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_28->outputs_,0);
    __rhs = Node::path_abi_cxx11_(*ppNVar7);
    condition = std::operator==("out.imp",__rhs);
    testing::Test::Check
              (pTVar1,condition,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x9a,"\"out.imp\" == edge->outputs_[0]->path()");
    testing::Test::Check
              (g_current_test,local_28->implicit_outs_ == 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x9b,"1 == edge->implicit_outs_");
    pEVar5 = local_28;
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"out.imp",&local_81);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_80);
    pEVar8 = Node::in_edge(pNVar4);
    testing::Test::Check
              (pTVar1,pEVar5 == pEVar8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x9c,"edge == GetNode(\"out.imp\")->in_edge()");
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(GraphTest, ImplicitOutputOnlyParse) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build | out.imp: cat in\n"));

  Edge* edge = GetNode("out.imp")->in_edge();
  EXPECT_EQ(1, edge->outputs_.size());
  EXPECT_EQ("out.imp", edge->outputs_[0]->path());
  EXPECT_EQ(1, edge->implicit_outs_);
  EXPECT_EQ(edge, GetNode("out.imp")->in_edge());
}